

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::PolicyOptionalWarningEnabled(cmMakefile *this,string *var)

{
  cmake *pcVar1;
  bool bVar2;
  byte bVar3;
  cmValue cVar4;
  char *extraout_RDX;
  string_view value;
  cmValue cVar5;
  
  cVar4 = GetDefinition(this,var);
  cVar5 = cVar4;
  if (cVar4.Value != (string *)0x0) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value);
    cVar5.Value = (string *)(ulong)bVar2;
  }
  bVar3 = (byte)cVar5.Value;
  if (cVar4.Value == (string *)0x0) {
    pcVar1 = this->GlobalGenerator->CMakeInstance;
    bVar3 = 1;
    if (pcVar1->DebugOutput == false) {
      bVar3 = pcVar1->Trace;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmMakefile::PolicyOptionalWarningEnabled(std::string const& var) const
{
  // Check for an explicit CMAKE_POLICY_WARNING_CMP<NNNN> setting.
  if (cmValue val = this->GetDefinition(var)) {
    return cmIsOn(val);
  }
  // Enable optional policy warnings with --debug-output, --trace,
  // or --trace-expand.
  cmake* cm = this->GetCMakeInstance();
  return cm->GetDebugOutput() || cm->GetTrace();
}